

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O3

png_uint_32 png_get_sRGB(png_const_structrp png_ptr,png_const_inforp info_ptr,int *file_srgb_intent)

{
  png_uint_32 pVar1;
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (file_srgb_intent != (int *)0x0)) && ((info_ptr->valid & 0x800) != 0)) {
    *file_srgb_intent = (uint)(info_ptr->colorspace).rendering_intent;
    pVar1 = 0x800;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_sRGB(png_const_structrp png_ptr, png_const_inforp info_ptr,
    int *file_srgb_intent)
{
   png_debug1(1, "in %s retrieval function", "sRGB");

   if (png_ptr != NULL && info_ptr != NULL &&
      (info_ptr->valid & PNG_INFO_sRGB) != 0 && file_srgb_intent != NULL)
   {
      *file_srgb_intent = info_ptr->colorspace.rendering_intent;
      return (PNG_INFO_sRGB);
   }

   return (0);
}